

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

Compressor * Imf_3_2::newCompressor(Compression c,size_t maxScanLineSize,Header *hdr)

{
  Header *hdr_00;
  size_t in_RDX;
  Header *in_RSI;
  int in_EDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  Header *in_stack_00000008;
  DwaCompressor *in_stack_00000010;
  size_t in_stack_00000048;
  size_t in_stack_00000050;
  Header *in_stack_00000058;
  PizCompressor *in_stack_00000060;
  bool in_stack_00000097;
  size_t in_stack_00000098;
  size_t in_stack_000000a0;
  Header *in_stack_000000a8;
  B44Compressor *in_stack_000000b0;
  size_t in_stack_ffffffffffffffb0;
  Header *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  ZipCompressor *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  undefined8 in_stack_fffffffffffffff8;
  AcCompression acCompression;
  RleCompressor *this;
  
  acCompression = (AcCompression)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  hdr_00 = (Header *)(ulong)(in_EDI - 1);
  switch(hdr_00) {
  case (Header *)0x0:
    this = (RleCompressor *)operator_new(0x28);
    RleCompressor::RleCompressor(this,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    break;
  case (Header *)0x1:
    this = (RleCompressor *)operator_new(0x38);
    ZipCompressor::ZipCompressor
              (in_stack_ffffffffffffffd0,hdr_00,in_stack_ffffffffffffffc0,(size_t)this);
    break;
  case (Header *)0x2:
    this = (RleCompressor *)operator_new(0x38);
    ZipCompressor::ZipCompressor
              (in_stack_ffffffffffffffd0,hdr_00,in_stack_ffffffffffffffc0,
               (size_t)in_stack_ffffffffffffffb8);
    break;
  case (Header *)0x3:
    this = (RleCompressor *)operator_new(0x58);
    PizCompressor::PizCompressor
              (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
    break;
  case (Header *)0x4:
    this = (RleCompressor *)operator_new(0x40);
    Pxr24Compressor::Pxr24Compressor
              ((Pxr24Compressor *)CONCAT44(in_EDI,in_stack_fffffffffffffff0),in_RSI,in_RDX,
               in_stack_ffffffffffffffd8);
    break;
  case (Header *)0x5:
    this = (RleCompressor *)operator_new(0x58);
    B44Compressor::B44Compressor
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
               in_stack_00000097);
    break;
  case (Header *)0x6:
    this = (RleCompressor *)operator_new(0x58);
    B44Compressor::B44Compressor
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
               in_stack_00000097);
    break;
  case (Header *)0x7:
    this = (RleCompressor *)operator_new(0x128);
    DwaCompressor::DwaCompressor
              (in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,acCompression);
    break;
  case (Header *)0x8:
    this = (RleCompressor *)operator_new(0x128);
    DwaCompressor::DwaCompressor
              (in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,acCompression);
    break;
  default:
    this = (RleCompressor *)0x0;
  }
  return &this->super_Compressor;
}

Assistant:

Compressor*
newCompressor (Compression c, size_t maxScanLineSize, const Header& hdr)
{
    switch (c)
    {
        case RLE_COMPRESSION: return new RleCompressor (hdr, maxScanLineSize);

        case ZIPS_COMPRESSION:

            return new ZipCompressor (hdr, maxScanLineSize, 1);

        case ZIP_COMPRESSION:

            return new ZipCompressor (hdr, maxScanLineSize, 16);

        case PIZ_COMPRESSION:

            return new PizCompressor (hdr, maxScanLineSize, 32);

        case PXR24_COMPRESSION:

            return new Pxr24Compressor (hdr, maxScanLineSize, 16);

        case B44_COMPRESSION:

            return new B44Compressor (hdr, maxScanLineSize, 32, false);

        case B44A_COMPRESSION:

            return new B44Compressor (hdr, maxScanLineSize, 32, true);

        case DWAA_COMPRESSION:

            return new DwaCompressor (
                hdr,
                static_cast<int> (maxScanLineSize),
                32,
                DwaCompressor::STATIC_HUFFMAN);

        case DWAB_COMPRESSION:

            return new DwaCompressor (
                hdr,
                static_cast<int> (maxScanLineSize),
                256,
                DwaCompressor::STATIC_HUFFMAN);

        default: return 0;
    }
}